

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps,double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
               double *vsigma_bb)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double t433;
  double t432;
  double t430;
  double t428;
  double t427;
  double t422;
  double t420;
  double t419;
  double t418;
  double t415;
  double t412;
  double t411;
  double t409;
  double t408;
  double t405;
  double t402;
  double t401;
  double t399;
  double t398;
  double t397;
  double t396;
  double t394;
  double t393;
  double t388;
  double t386;
  double t385;
  double t382;
  double t378;
  double t377;
  double t376;
  double t375;
  double t372;
  double t370;
  double t366;
  double t365;
  double t364;
  double t363;
  double t362;
  double t361;
  double t359;
  double t356;
  double t353;
  double t352;
  double t351;
  double t350;
  double t349;
  double t347;
  double t344;
  double t343;
  double t340;
  double t338;
  double t337;
  double t336;
  double t335;
  double t334;
  double t332;
  double t331;
  double t326;
  double t325;
  double t324;
  double t323;
  double t322;
  double t320;
  double t319;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t308;
  double t307;
  double t305;
  double t304;
  double t303;
  double t302;
  double t298;
  double t297;
  double t296;
  double t295;
  double t292;
  double t290;
  double t287;
  double t286;
  double t285;
  double t283;
  double t282;
  double t281;
  double t277;
  double t276;
  double t274;
  double t273;
  double t272;
  double t269;
  double t268;
  double t266;
  double t265;
  double t264;
  double t263;
  double t262;
  double t260;
  double t257;
  double t256;
  double t253;
  double t252;
  double t251;
  double t250;
  double t249;
  double t247;
  double t246;
  double t245;
  double t244;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t234;
  double t233;
  double t232;
  double t227;
  double t226;
  double t225;
  double t219;
  double t218;
  double t217;
  double t212;
  double t211;
  double t210;
  double t206;
  double t205;
  double t204;
  double t202;
  double t199;
  double t198;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t190;
  double t189;
  double t188;
  double t187;
  double t186;
  double t185;
  double t184;
  double t183;
  double t182;
  double t181;
  double t180;
  double t179;
  double t177;
  double t172;
  double t171;
  double t170;
  double t168;
  double t166;
  double t165;
  double t163;
  double t161;
  double t160;
  double t159;
  double t158;
  double t157;
  double t155;
  double t154;
  double t152;
  double t151;
  double t150;
  double t148;
  double t147;
  double t146;
  double t142;
  double t141;
  double t138;
  double t134;
  double t133;
  double t132;
  double t131;
  double t129;
  double t127;
  double t125;
  double t124;
  double t123;
  double t122;
  double t121;
  double t119;
  double t118;
  double t112;
  double t108;
  double t106;
  double t105;
  double t103;
  double t101;
  double t100;
  double t99;
  double t98;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t85;
  double t84;
  double t83;
  double t80;
  double t75;
  double t71;
  double t70;
  double t67;
  double t62;
  double t60;
  double t59;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t42;
  double t41;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t27;
  double t25;
  double t22;
  double t17;
  double t14;
  double t13;
  double t11;
  double t8;
  double t7;
  double t417;
  double t416;
  double t414;
  double t404;
  double t288;
  double t280;
  double t275;
  double t164;
  double t143;
  double t137;
  double t136;
  double t135;
  double t130;
  double t116;
  double t115;
  double t111;
  double t110;
  double t21;
  double t20;
  double t19;
  double t6;
  double t4;
  double t56;
  double t5;
  double t3;
  double t1;
  double in_stack_fffffffffffff6d0;
  double dVar63;
  
  dVar1 = in_XMM0_Qa + in_XMM1_Qa;
  dVar2 = safe_math::cbrt<double>(9.28511896133184e-318);
  dVar3 = 2.4814019635975995 / dVar2;
  dVar4 = dVar3 * 0.053425 + 1.0;
  dVar5 = safe_math::sqrt<double>(9.28561796763414e-318);
  dVar6 = pow_3_2<double>(in_stack_fffffffffffff6d0);
  dVar7 = dVar2 * dVar2;
  dVar8 = 1.5393389262365056 / dVar7;
  dVar9 = dVar8 * 0.123235 + dVar6 * 0.204775 + dVar5 * 3.79785 + dVar3 * 0.8969;
  dVar10 = safe_math::log<double>(9.28681854715353e-318);
  dVar11 = dVar4 * 0.0621814 * dVar10;
  dVar12 = in_XMM0_Qa - in_XMM1_Qa;
  dVar13 = dVar12 * dVar12;
  dVar14 = dVar1 * dVar1;
  dVar15 = dVar14 * dVar14;
  dVar16 = dVar13 * dVar13 * (1.0 / dVar15);
  dVar17 = 1.0 / dVar1;
  dVar18 = dVar12 * dVar17 + 1.0;
  dVar63 = 1e-15;
  dVar62 = (double)(-(ulong)(dVar18 <= 1e-15) & 0x3ff0000000000000);
  dVar19 = safe_math::cbrt<double>(9.28860706479148e-318);
  dVar20 = dVar19 * dVar63;
  dVar21 = safe_math::cbrt<double>(9.28885903827086e-318);
  dVar18 = piecewise_functor_3<double>((bool)(-(dVar62 != 0.0) & 1),dVar20,dVar21 * dVar18);
  dVar22 = 1.0 - dVar12 * dVar17;
  dVar63 = (double)(-(ulong)(dVar22 <= dVar63) & 0x3ff0000000000000);
  dVar23 = safe_math::cbrt<double>(9.28975823774629e-318);
  dVar20 = piecewise_functor_3<double>(dVar63 != 0.0,dVar20,dVar23 * dVar22);
  dVar18 = ((dVar18 + dVar20) - 2.0) * 1.9236610509315362;
  dVar20 = dVar3 * 0.05137 + 1.0;
  dVar22 = dVar8 * 0.1562925 + dVar6 * 0.420775 + dVar5 * 7.05945 + dVar3 * 1.549425;
  dVar24 = safe_math::log<double>(9.29161098391819e-318);
  dVar25 = dVar3 * 0.0278125 + 1.0;
  dVar3 = dVar8 * 0.1241775 + dVar6 * 0.1100325 + dVar5 * 5.1785 + dVar3 * 0.905775;
  dVar6 = safe_math::log<double>(9.29261887783571e-318);
  dVar8 = dVar25 * dVar6;
  dVar26 = dVar8 * -0.0197516734986138 + dVar20 * -0.0310907 * dVar24 + dVar11;
  dVar27 = dVar18 * dVar26;
  dVar28 = dVar16 * dVar27;
  dVar29 = dVar18 * 0.0197516734986138 * dVar8;
  dVar30 = piecewise_functor_3<double>(dVar62 != 0.0,dVar19 * dVar19,dVar21 * dVar21);
  dVar19 = piecewise_functor_3<double>(dVar63 != 0.0,dVar19 * dVar19,dVar23 * dVar23);
  dVar19 = dVar30 / 2.0 + dVar19 / 2.0;
  dVar30 = dVar19 * dVar19;
  dVar31 = dVar30 * dVar19;
  dVar32 = dVar31 * 0.031090690869654894;
  dVar33 = in_XMM3_Qa + in_XMM3_Qa + (double)CONCAT44(in_XMM2_Db,in_XMM2_Da) + in_XMM4_Qa;
  dVar34 = (1.0 / dVar2) / dVar14;
  dVar35 = dVar33 * dVar34;
  dVar36 = (1.0 / dVar30) * 2.080083823051904 * 2.3248947030192535;
  dVar37 = (-dVar11 + dVar28 + dVar29) * 32.16396844291482;
  dVar38 = 1.0 / dVar31;
  dVar39 = safe_math::exp<double>(9.29684313910765e-318);
  dVar40 = dVar39 - 1.0;
  dVar41 = 1.0 / dVar40;
  dVar42 = dVar33 * dVar33;
  dVar43 = dVar41 * 32.16396844291482 * 0.06672455060314922 * dVar42;
  dVar44 = (1.0 / dVar7) / dVar15;
  dVar45 = 1.0 / (dVar30 * dVar30);
  dVar46 = dVar44 * 1.5874010519681996 * dVar45 * 7.795554179441513;
  dVar47 = (dVar35 * 1.2599210498948732 * dVar36) / 96.0 + (dVar43 * dVar46) / 3072.0;
  dVar48 = dVar47 * 0.06672455060314922;
  dVar49 = dVar41 * 2.1461263399673647 * dVar47 + 1.0;
  dVar50 = (1.0 / dVar49) * 32.16396844291482;
  dVar51 = safe_math::log<double>(9.29974330444874e-318);
  dVar52 = dVar32 * dVar51;
  dVar53 = (1.0 / dVar2) / dVar1;
  dVar54 = dVar53 * 2.519842099789747;
  dVar10 = dVar54 * 0.9847450218426962 * dVar10 * 0.0011073470983333333;
  dVar5 = (1.0 / dVar5) * 1.4422495703074083 * dVar53 * 1.720508027656199;
  dVar55 = dVar54 * 0.9847450218426962;
  dVar56 = safe_math::sqrt<double>(9.3015664066819e-318);
  dVar56 = dVar56 * 1.4422495703074083 * dVar53 * 1.720508027656199;
  dVar57 = (1.5393389262365056 / dVar7) / dVar1;
  dVar4 = dVar4 * (1.0 / (dVar9 * dVar9)) *
          (dVar57 * -0.08215666666666667 +
          dVar56 * -0.1023875 + dVar5 * -0.632975 + -(dVar55 * 0.29896666666666666)) *
          (1.0 / (16.081979498692537 / dVar9 + 1.0)) * 1.0;
  dVar9 = dVar13 * dVar12 * (1.0 / dVar15) * dVar27 * 4.0;
  dVar13 = dVar13 * dVar13 * (1.0 / (dVar15 * dVar1)) * dVar27 * 4.0;
  dVar12 = dVar12 * (1.0 / dVar14);
  dVar27 = dVar17 - dVar12;
  dVar58 = piecewise_functor_3<double>(dVar62 != 0.0,0.0,dVar21 * 1.3333333333333333 * dVar27);
  dVar59 = piecewise_functor_3<double>(dVar63 != 0.0,0.0,dVar23 * 1.3333333333333333 * -dVar27);
  dVar58 = (dVar58 + dVar59) * 1.9236610509315362;
  dVar59 = dVar16 * dVar58 * dVar26;
  dVar60 = 1.0 / (dVar3 * dVar3);
  dVar61 = dVar57 * -0.082785 +
           dVar56 * -0.05501625 + dVar5 * -0.8630833333333333 + -(dVar55 * 0.301925);
  dVar3 = 1.0 / (29.608749977793437 / dVar3 + 1.0);
  dVar5 = dVar16 * dVar18 * (dVar25 * dVar60 * 0.5848223622634646 * dVar61 * dVar3 +
                            dVar54 * 0.00018032106577324796 * dVar6 +
                            (((dVar54 * 0.0005242550290131881 * dVar24 +
                              dVar20 * (1.0 / (dVar22 * dVar22)) * 1.0 *
                              (dVar57 * -0.104195 +
                              dVar56 * -0.2103875 + dVar5 * -1.176575 + -(dVar55 * 0.516475)) *
                              (1.0 / (32.16395899738507 / dVar22 + 1.0))) - dVar10) - dVar4));
  dVar20 = dVar58 * dVar8 * 0.0197516734986138;
  dVar6 = dVar18 * 1.4422495703074083 * dVar53 * 1.720508027656199 * dVar6 * 0.00018311447306006544;
  dVar3 = dVar18 * dVar25 * dVar60 * dVar61 * dVar3 * 0.5848223622634646;
  dVar18 = piecewise_functor_3<double>
                     (dVar62 != 0.0,0.0,(1.0 / dVar21) * 0.6666666666666666 * dVar27);
  dVar22 = piecewise_functor_3<double>
                     (dVar63 != 0.0,0.0,(1.0 / dVar23) * 0.6666666666666666 * -dVar27);
  dVar18 = dVar18 / 2.0 + dVar22 / 2.0;
  dVar36 = dVar33 * ((1.0 / dVar2) / (dVar14 * dVar1)) * 0.024305555555555556 * 1.2599210498948732 *
           dVar36;
  dVar35 = dVar35 * dVar38 * 1.2599210498948732;
  dVar25 = 1.0 / (dVar40 * dVar40);
  dVar2 = dVar25 * dVar42 * 2.1461263399673647 * dVar44;
  dVar14 = dVar45 * 1.5874010519681996 * 1.4422495703074083;
  dVar22 = dVar37 * 3.0 * dVar45 * dVar18 +
           -((((((dVar10 + dVar4 + dVar9) - dVar13) + dVar59 + dVar5 + dVar20) - dVar6) - dVar3) *
             32.16396844291482 * dVar38);
  dVar7 = dVar43 * 0.0015190972222222222 *
          ((1.0 / dVar7) / (dVar15 * dVar1)) * 1.5874010519681996 * dVar45 * 7.795554179441513;
  dVar44 = dVar41 * dVar42 * 2.1461263399673647 * dVar44;
  dVar15 = ((1.0 / (dVar30 * dVar30)) / dVar19) * 1.5874010519681996 * 1.4422495703074083;
  dVar19 = (((-dVar36 - (dVar35 * dVar18 * 1.5874010519681996 * 3.0464738926897783) / 48.0) -
            (dVar2 * dVar14 * dVar22 * dVar39 * 5.405135380126985) / 3072.0) - dVar7) -
           (dVar44 * dVar15 * 5.405135380126985 * dVar18) / 768.0;
  dVar42 = 1.0 / (dVar49 * dVar49);
  dVar24 = dVar42 * 32.16396844291482;
  dVar25 = dVar25 * 2.1461263399673647;
  dVar27 = 1.0 / (dVar48 * dVar50 + 1.0);
  dVar12 = -dVar17 - dVar12;
  dVar17 = piecewise_functor_3<double>(dVar62 != 0.0,0.0,dVar21 * 1.3333333333333333 * dVar12);
  dVar40 = piecewise_functor_3<double>(dVar63 != 0.0,0.0,dVar23 * 1.3333333333333333 * -dVar12);
  dVar17 = (dVar17 + dVar40) * 1.9236610509315362;
  dVar16 = dVar16 * dVar17 * dVar26;
  dVar8 = dVar17 * dVar8 * 0.0197516734986138;
  dVar62 = piecewise_functor_3<double>
                     (dVar62 != 0.0,0.0,(1.0 / dVar21) * 0.6666666666666666 * dVar12);
  dVar17 = piecewise_functor_3<double>
                     (dVar63 != 0.0,0.0,(1.0 / dVar23) * 0.6666666666666666 * -dVar12);
  dVar62 = dVar62 / 2.0 + dVar17 / 2.0;
  dVar17 = dVar37 * 3.0 * dVar45 * dVar62 +
           -(((((((dVar10 + dVar4) - dVar9) - dVar13) + dVar16 + dVar5 + dVar8) - dVar6) - dVar3) *
             32.16396844291482 * dVar38);
  dVar2 = (((-dVar36 - (dVar35 * dVar62 * 1.5874010519681996 * 3.0464738926897783) / 48.0) -
           (dVar2 * dVar14 * dVar17 * dVar39 * 5.405135380126985) / 3072.0) - dVar7) -
          (dVar44 * dVar15 * 5.405135380126985 * dVar62) / 768.0;
  dVar7 = dVar34 * 1.2599210498948732 * (1.0 / dVar30) * 4.83597586204941;
  dVar46 = dVar41 * 32.16396844291482 * 0.06672455060314922 * dVar33 * dVar46;
  dVar14 = dVar7 / 96.0 + dVar46 / 1536.0;
  dVar15 = dVar47 * 0.004452165653192221 * 1034.5208659968205;
  dVar42 = dVar42 * dVar41;
  dVar7 = dVar7 / 48.0 + dVar46 / 768.0;
  *in_RDI = -dVar11 + dVar28 + dVar29 + dVar52;
  *in_RSI = ((dVar1 * ((((((dVar10 + dVar4 + dVar9) - dVar13) + dVar59 + dVar5 + dVar20) - dVar6) -
                       dVar3) + dVar30 * 0.031090690869654894 * dVar51 * dVar18 * 3.0 +
                      dVar32 * (-dVar48 * dVar24 * (-dVar25 * dVar47 * dVar22 * dVar39 +
                                                   dVar41 * 2.1461263399673647 * dVar19) +
                               dVar19 * 0.06672455060314922 * dVar50) * dVar27) + dVar52) - dVar11)
            + dVar28 + dVar29;
  *in_RDX = ((dVar1 * (((((((dVar10 + dVar4) - dVar9) - dVar13) + dVar16 + dVar5 + dVar8) - dVar6) -
                       dVar3) + dVar30 * 0.031090690869654894 * dVar51 * dVar62 * 3.0 +
                      dVar32 * (-dVar48 * dVar24 * (-dVar25 * dVar47 * dVar17 * dVar39 +
                                                   dVar41 * 2.1461263399673647 * dVar2) +
                               dVar2 * 0.06672455060314922 * dVar50) * dVar27) + dVar52) - dVar11) +
            dVar28 + dVar29;
  *in_RCX = dVar1 * 0.031090690869654894 * dVar31 *
            (dVar14 * 0.06672455060314922 * dVar50 + -(dVar15 * dVar42 * dVar14)) * dVar27;
  *in_R8 = dVar1 * 0.031090690869654894 *
           dVar31 * (dVar7 * 0.06672455060314922 * dVar50 + -(dVar15 * dVar42 * dVar7)) * dVar27;
  *in_R9 = *in_RCX;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t56 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t19 = t1 * t1;
    constexpr double t20 = t3 * t3;
    constexpr double t21 = t19 * t20;
    constexpr double t110 = 0.1e1 / t3;
    constexpr double t111 = t110 * t5;
    constexpr double t115 = BB * beta;
    constexpr double t116 = 0.1e1 / gamma;
    constexpr double t130 = t56 * t56;
    constexpr double t135 = 0.1e1 / t20;
    constexpr double t136 = t1 * t135;
    constexpr double t137 = t136 * t6;
    constexpr double t143 = beta * t116;
    constexpr double t164 = t3 * t6;
    constexpr double t275 = t19 * t110;
    constexpr double t280 = t115 * t116;
    constexpr double t288 = t135 * t6;
    constexpr double t404 = t275 * t5;
    constexpr double t414 = beta * beta;
    constexpr double t416 = gamma * gamma;
    constexpr double t417 = 0.1e1 / t416;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t11 = t4 * t6 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t5 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = rho_a - rho_b;
    const double t35 = t34 * t34;
    const double t36 = t35 * t35;
    const double t37 = t7 * t7;
    const double t38 = t37 * t37;
    const double t39 = 0.1e1 / t38;
    const double t40 = t36 * t39;
    const double t41 = 0.1e1 / t7;
    const double t42 = t34 * t41;
    const double t43 = 0.1e1 + t42;
    const double t44 = t43 <= zeta_tol;
    const double t45 = safe_math::cbrt( zeta_tol );
    const double t46 = t45 * zeta_tol;
    const double t47 = safe_math::cbrt( t43 );
    const double t48 = t47 * t43;
    const double t49 = piecewise_functor_3( t44, t46, t48 );
    const double t50 = 0.1e1 - t42;
    const double t51 = t50 <= zeta_tol;
    const double t52 = safe_math::cbrt( t50 );
    const double t53 = t52 * t50;
    const double t54 = piecewise_functor_3( t51, t46, t53 );
    const double t55 = t49 + t54 - 0.2e1;
    const double t59 = 0.1e1 / ( 0.2e1 * t56 - 0.2e1 );
    const double t60 = t55 * t59;
    const double t62 = 0.1e1 + 0.5137e-1 * t11;
    const double t67 = 0.705945e1 * t14 + 0.1549425e1 * t11 + 0.420775e0 * t17 + 0.1562925e0 * t25;
    const double t70 = 0.1e1 + 0.32163958997385070134e2 / t67;
    const double t71 = safe_math::log( t70 );
    const double t75 = 0.1e1 + 0.278125e-1 * t11;
    const double t80 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t83 = 0.1e1 + 0.29608749977793437516e2 / t80;
    const double t84 = safe_math::log( t83 );
    const double t85 = t75 * t84;
    const double t87 = -0.310907e-1 * t62 * t71 + t33 - 0.19751673498613801407e-1 * t85;
    const double t88 = t60 * t87;
    const double t89 = t40 * t88;
    const double t91 = 0.19751673498613801407e-1 * t60 * t85;
    const double t92 = t45 * t45;
    const double t93 = t47 * t47;
    const double t94 = piecewise_functor_3( t44, t92, t93 );
    const double t95 = t52 * t52;
    const double t96 = piecewise_functor_3( t51, t92, t95 );
    const double t98 = t94 / 0.2e1 + t96 / 0.2e1;
    const double t99 = t98 * t98;
    const double t100 = t99 * t98;
    const double t101 = gamma * t100;
    const double t103 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t105 = 0.1e1 / t8 / t37;
    const double t106 = t103 * t105;
    const double t108 = 0.1e1 / t99;
    const double t112 = t108 * t19 * t111;
    const double t118 = ( -t33 + t89 + t91 ) * t116;
    const double t119 = 0.1e1 / t100;
    const double t121 = safe_math::exp( -t118 * t119 );
    const double t122 = t121 - 0.1e1;
    const double t123 = 0.1e1 / t122;
    const double t124 = t116 * t123;
    const double t125 = t103 * t103;
    const double t127 = t115 * t124 * t125;
    const double t129 = 0.1e1 / t22 / t38;
    const double t131 = t129 * t130;
    const double t132 = t99 * t99;
    const double t133 = 0.1e1 / t132;
    const double t134 = t131 * t133;
    const double t138 = t134 * t137;
    const double t141 = t106 * t56 * t112 / 0.96e2 + t127 * t138 / 0.3072e4;
    const double t142 = beta * t141;
    const double t146 = t143 * t123 * t141 + 0.1e1;
    const double t147 = 0.1e1 / t146;
    const double t148 = t116 * t147;
    const double t150 = t142 * t148 + 0.1e1;
    const double t151 = safe_math::log( t150 );
    const double t152 = t101 * t151;
    const double t154 = 0.1e1 / t8 / t7;
    const double t155 = t6 * t154;
    const double t157 = t4 * t155 * t31;
    const double t158 = 0.11073470983333333333e-2 * t157;
    const double t159 = t27 * t27;
    const double t160 = 0.1e1 / t159;
    const double t161 = t13 * t160;
    const double t163 = 0.1e1 / t14 * t1;
    const double t165 = t164 * t154;
    const double t166 = t163 * t165;
    const double t168 = t4 * t155;
    const double t170 = safe_math::sqrt( t11 );
    const double t171 = t170 * t1;
    const double t172 = t171 * t165;
    const double t177 = t21 * t5 / t22 / t7;
    const double t179 = -0.632975e0 * t166 - 0.29896666666666666667e0 * t168 - 0.1023875e0 * t172 - 0.82156666666666666667e-1 * t177;
    const double t180 = 0.1e1 / t30;
    const double t181 = t179 * t180;
    const double t182 = t161 * t181;
    const double t183 = 0.1e1 * t182;
    const double t184 = t35 * t34;
    const double t185 = t184 * t39;
    const double t186 = t185 * t88;
    const double t187 = 0.4e1 * t186;
    const double t188 = t38 * t7;
    const double t189 = 0.1e1 / t188;
    const double t190 = t36 * t189;
    const double t191 = t190 * t88;
    const double t192 = 0.4e1 * t191;
    const double t193 = 0.1e1 / t37;
    const double t194 = t34 * t193;
    const double t195 = t41 - t194;
    const double t198 = piecewise_functor_3( t44, 0.0, 0.4e1 / 0.3e1 * t47 * t195 );
    const double t199 = -t195;
    const double t202 = piecewise_functor_3( t51, 0.0, 0.4e1 / 0.3e1 * t52 * t199 );
    const double t204 = ( t198 + t202 ) * t59;
    const double t205 = t204 * t87;
    const double t206 = t40 * t205;
    const double t210 = t67 * t67;
    const double t211 = 0.1e1 / t210;
    const double t212 = t62 * t211;
    const double t217 = -0.1176575e1 * t166 - 0.516475e0 * t168 - 0.2103875e0 * t172 - 0.104195e0 * t177;
    const double t218 = 0.1e1 / t70;
    const double t219 = t217 * t218;
    const double t225 = t80 * t80;
    const double t226 = 0.1e1 / t225;
    const double t227 = t75 * t226;
    const double t232 = -0.86308333333333333334e0 * t166 - 0.301925e0 * t168 - 0.5501625e-1 * t172 - 0.82785e-1 * t177;
    const double t233 = 0.1e1 / t83;
    const double t234 = t232 * t233;
    const double t237 = 0.53237641966666666666e-3 * t4 * t155 * t71 + 0.1e1 * t212 * t219 - t158 - t183 + 0.18311447306006545054e-3 * t4 * t155 * t84 + 0.5848223622634646207e0 * t227 * t234;
    const double t238 = t60 * t237;
    const double t239 = t40 * t238;
    const double t240 = t204 * t85;
    const double t241 = 0.19751673498613801407e-1 * t240;
    const double t242 = t60 * t1;
    const double t244 = t164 * t154 * t84;
    const double t245 = t242 * t244;
    const double t246 = 0.18311447306006545054e-3 * t245;
    const double t247 = t60 * t75;
    const double t249 = t226 * t232 * t233;
    const double t250 = t247 * t249;
    const double t251 = 0.5848223622634646207e0 * t250;
    const double t252 = gamma * t99;
    const double t253 = 0.1e1 / t47;
    const double t256 = piecewise_functor_3( t44, 0.0, 0.2e1 / 0.3e1 * t253 * t195 );
    const double t257 = 0.1e1 / t52;
    const double t260 = piecewise_functor_3( t51, 0.0, 0.2e1 / 0.3e1 * t257 * t199 );
    const double t262 = t256 / 0.2e1 + t260 / 0.2e1;
    const double t263 = t151 * t262;
    const double t264 = t252 * t263;
    const double t265 = 0.3e1 * t264;
    const double t266 = t37 * t7;
    const double t268 = 0.1e1 / t8 / t266;
    const double t269 = t103 * t268;
    const double t272 = 0.7e1 / 0.288e3 * t269 * t56 * t112;
    const double t273 = t56 * t119;
    const double t274 = t106 * t273;
    const double t276 = t5 * t262;
    const double t277 = t275 * t276;
    const double t281 = t122 * t122;
    const double t282 = 0.1e1 / t281;
    const double t283 = t282 * t125;
    const double t285 = t280 * t283 * t129;
    const double t286 = t130 * t133;
    const double t287 = t286 * t1;
    const double t290 = ( t158 + t183 + t187 - t192 + t206 + t239 + t241 - t246 - t251 ) * t116;
    const double t292 = t133 * t262;
    const double t295 = 0.3e1 * t118 * t292 - t290 * t119;
    const double t296 = t295 * t121;
    const double t297 = t288 * t296;
    const double t298 = t287 * t297;
    const double t302 = 0.1e1 / t22 / t188;
    const double t303 = t302 * t130;
    const double t304 = t303 * t133;
    const double t305 = t304 * t137;
    const double t307 = 0.7e1 / 0.4608e4 * t127 * t305;
    const double t308 = t123 * t125;
    const double t310 = t280 * t308 * t129;
    const double t312 = 0.1e1 / t132 / t98;
    const double t313 = t130 * t312;
    const double t314 = t313 * t1;
    const double t316 = t314 * t288 * t262;
    const double t319 = -t272 - t274 * t277 / 0.48e2 - t285 * t298 / 0.3072e4 - t307 - t310 * t316 / 0.768e3;
    const double t320 = beta * t319;
    const double t322 = t146 * t146;
    const double t323 = 0.1e1 / t322;
    const double t324 = t116 * t323;
    const double t325 = t143 * t282;
    const double t326 = t141 * t295;
    const double t331 = -t325 * t326 * t121 + t143 * t123 * t319;
    const double t332 = t324 * t331;
    const double t334 = -t142 * t332 + t320 * t148;
    const double t335 = 0.1e1 / t150;
    const double t336 = t334 * t335;
    const double t337 = t101 * t336;
    const double t338 = t158 + t183 + t187 - t192 + t206 + t239 + t241 - t246 - t251 + t265 + t337;
    const double t340 = -t41 - t194;
    const double t343 = piecewise_functor_3( t44, 0.0, 0.4e1 / 0.3e1 * t47 * t340 );
    const double t344 = -t340;
    const double t347 = piecewise_functor_3( t51, 0.0, 0.4e1 / 0.3e1 * t52 * t344 );
    const double t349 = ( t343 + t347 ) * t59;
    const double t350 = t349 * t87;
    const double t351 = t40 * t350;
    const double t352 = t349 * t85;
    const double t353 = 0.19751673498613801407e-1 * t352;
    const double t356 = piecewise_functor_3( t44, 0.0, 0.2e1 / 0.3e1 * t253 * t340 );
    const double t359 = piecewise_functor_3( t51, 0.0, 0.2e1 / 0.3e1 * t257 * t344 );
    const double t361 = t356 / 0.2e1 + t359 / 0.2e1;
    const double t362 = t151 * t361;
    const double t363 = t252 * t362;
    const double t364 = 0.3e1 * t363;
    const double t365 = t5 * t361;
    const double t366 = t275 * t365;
    const double t370 = ( t158 + t183 - t187 - t192 + t351 + t239 + t353 - t246 - t251 ) * t116;
    const double t372 = t133 * t361;
    const double t375 = 0.3e1 * t118 * t372 - t370 * t119;
    const double t376 = t375 * t121;
    const double t377 = t288 * t376;
    const double t378 = t287 * t377;
    const double t382 = t314 * t288 * t361;
    const double t385 = -t272 - t274 * t366 / 0.48e2 - t285 * t378 / 0.3072e4 - t307 - t310 * t382 / 0.768e3;
    const double t386 = beta * t385;
    const double t388 = t141 * t375;
    const double t393 = -t325 * t388 * t121 + t143 * t123 * t385;
    const double t394 = t324 * t393;
    const double t396 = -t142 * t394 + t386 * t148;
    const double t397 = t396 * t335;
    const double t398 = t101 * t397;
    const double t399 = t158 + t183 - t187 - t192 + t351 + t239 + t353 - t246 - t251 + t364 + t398;
    const double t401 = t7 * gamma;
    const double t402 = t105 * t56;
    const double t405 = t402 * t108 * t404;
    const double t408 = t115 * t124 * t103;
    const double t409 = t408 * t138;
    const double t411 = t405 / 0.96e2 + t409 / 0.1536e4;
    const double t412 = beta * t411;
    const double t415 = t414 * t141;
    const double t418 = t415 * t417;
    const double t419 = t323 * t123;
    const double t420 = t419 * t411;
    const double t422 = t412 * t148 - t418 * t420;
    const double t427 = t405 / 0.48e2 + t409 / 0.768e3;
    const double t428 = beta * t427;
    const double t430 = t419 * t427;
    const double t432 = t428 * t148 - t418 * t430;
    const double t433 = t100 * t432;


    eps = -t33 + t89 + t91 + t152;
    vrho_a = t7 * t338 + t152 - t33 + t89 + t91;
    vrho_b = t7 * t399 + t152 - t33 + t89 + t91;
    vsigma_aa = t401 * t100 * t422 * t335;
    vsigma_ab = t401 * t433 * t335;
    vsigma_bb = vsigma_aa;

  }